

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxpool.h
# Opt level: O2

infinite_counter<unsigned_long,_18446744073709551615UL> * __thiscall
cxxpool::detail::infinite_counter<unsigned_long,_18446744073709551615UL>::operator++
          (infinite_counter<unsigned_long,_18446744073709551615UL> *this)

{
  pointer puVar1;
  unsigned_long uVar2;
  unsigned_long local_18;
  
  puVar1 = (this->count_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar2 = puVar1[-1];
  if (uVar2 == 0xffffffffffffffff) {
    local_18 = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              (&this->count_,&local_18);
  }
  else {
    puVar1[-1] = uVar2 + 1;
  }
  return this;
}

Assistant:

infinite_counter& operator++() {
        if (count_.back() == max)
            count_.push_back(0);
        else
            ++count_.back();
        return *this;
    }